

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Server.cpp
# Opt level: O3

Client * __thiscall Server::Private::pair(Private *this,ICallback *callback,Socket *otherSocket)

{
  bool bVar1;
  ClientImpl *this_00;
  int size;
  Socket socket;
  Socket local_24;
  Socket *pSVar2;
  
  Socket::Socket(&local_24);
  pSVar2 = otherSocket;
  bVar1 = Socket::pair(&local_24,otherSocket);
  size = (int)pSVar2;
  if (bVar1) {
    bVar1 = Socket::setNonBlocking(&local_24);
    if (bVar1) {
      if (this->_keepAlive == true) {
        bVar1 = Socket::setKeepAlive(&local_24);
        if (!bVar1) goto LAB_0010e0cb;
      }
      if (this->_noDelay == true) {
        bVar1 = Socket::setNoDelay(&local_24);
        if (!bVar1) goto LAB_0010e0cb;
      }
      size = this->_sendBufferSize;
      if (0 < size) {
        bVar1 = Socket::setSendBufferSize(&local_24,size);
        if (!bVar1) goto LAB_0010e0cb;
      }
      size = this->_receiveBufferSize;
      if (0 < size) {
        bVar1 = Socket::setReceiveBufferSize(&local_24,size);
        if (!bVar1) goto LAB_0010e0cb;
      }
      this_00 = PoolList<Server::Private::ClientImpl>::append<Server::Private&>
                          (&this->_clients,this);
      this_00->_callback = callback;
      Socket::swap(&this_00->super_Socket,&local_24);
      Socket::Poll::set(&this->_sockets,&this_00->super_Socket,1);
      goto LAB_0010e0d6;
    }
  }
LAB_0010e0cb:
  Socket::close(otherSocket,size);
  this_00 = (ClientImpl *)0x0;
LAB_0010e0d6:
  Socket::~Socket(&local_24);
  return (Client *)this_00;
}

Assistant:

Server::Client *Server::Private::pair(Client::ICallback &callback, Socket &otherSocket)
{
  Socket socket;
  if (!socket.pair(otherSocket) ||
      !socket.setNonBlocking() ||
      (_keepAlive && !socket.setKeepAlive()) ||
      (_noDelay && !socket.setNoDelay()) ||
      (_sendBufferSize > 0 && !socket.setSendBufferSize(_sendBufferSize)) ||
      (_receiveBufferSize > 0 && !socket.setReceiveBufferSize(_receiveBufferSize)))
  {
    otherSocket.close();
    return 0;
  }
  ClientImpl &client = _clients.append<Server::Private &>(*this);
  client._callback = &callback;
  client.swap(socket);
  _sockets.set(client, Socket::Poll::readFlag);
  return (Server::Client *)&client;
}